

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ThreadSafeArena::Init(ThreadSafeArena *this)

{
  LogMessage *other;
  LogFinisher local_c5 [20];
  byte local_b1;
  LogMessage local_b0;
  undefined4 local_74;
  undefined8 uStack_70;
  memory_order relaxed;
  uint64_t kInc;
  uint64_t kDelta;
  uint64_t id;
  ThreadCache *tc;
  ThreadSafeArena *pTStack_48;
  bool was_message_owned;
  ThreadSafeArena *this_local;
  ThreadSafeArena *local_38;
  long local_30;
  undefined8 local_28;
  undefined4 local_1c;
  undefined8 local_18;
  undefined8 *local_10;
  
  tc._7_1_ = (*(ulong *)this & 1) != 0;
  pTStack_48 = this;
  local_38 = this;
  id = (uint64_t)thread_cache();
  kDelta = ((ThreadCache *)id)->next_lifecycle_id;
  kInc = 2;
  uStack_70 = 0x200;
  if ((kDelta & 0x1ff) == 0) {
    local_74 = 0;
    local_10 = &lifecycle_id_generator_;
    local_18 = 1;
    local_1c = 0;
    local_28 = 1;
    LOCK();
    local_30 = lifecycle_id_generator_;
    UNLOCK();
    kDelta = lifecycle_id_generator_ << 9;
    lifecycle_id_generator_ = lifecycle_id_generator_ + 1;
  }
  ((ThreadCache *)id)->next_lifecycle_id = kDelta + 2;
  *(uint64_t *)this = kDelta | *(ulong *)this & 1;
  std::atomic<google::protobuf::internal::SerialArena_*>::store
            ((atomic<google::protobuf::internal::SerialArena_*> *)(this + 0x18),(__pointer_type)0x0,
             memory_order_relaxed);
  std::atomic<google::protobuf::internal::SerialArena_*>::store
            ((atomic<google::protobuf::internal::SerialArena_*> *)(this + 0x10),(__pointer_type)0x0,
             memory_order_relaxed);
  local_b1 = 0;
  this_local = this;
  if ((bool)(tc._7_1_ & 1) != ((*(ulong *)this & 1) != 0)) {
    LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
               ,0x139);
    local_b1 = 1;
    other = LogMessage::operator<<
                      (&local_b0,"CHECK failed: (was_message_owned) == (IsMessageOwned()): ");
    LogFinisher::operator=(local_c5,other);
  }
  if ((local_b1 & 1) != 0) {
    LogMessage::~LogMessage(&local_b0);
  }
  return;
}

Assistant:

void ThreadSafeArena::Init() {
#ifndef NDEBUG
  const bool was_message_owned = IsMessageOwned();
#endif  // NDEBUG
  ThreadCache& tc = thread_cache();
  auto id = tc.next_lifecycle_id;
  // We increment lifecycle_id's by multiples of two so we can use bit 0 as
  // a tag.
  constexpr uint64_t kDelta = 2;
  constexpr uint64_t kInc = ThreadCache::kPerThreadIds * kDelta;
  if (PROTOBUF_PREDICT_FALSE((id & (kInc - 1)) == 0)) {
    constexpr auto relaxed = std::memory_order_relaxed;
    // On platforms that don't support uint64_t atomics we can certainly not
    // afford to increment by large intervals and expect uniqueness due to
    // wrapping, hence we only add by 1.
    id = lifecycle_id_generator_.id.fetch_add(1, relaxed) * kInc;
  }
  tc.next_lifecycle_id = id + kDelta;
  // Message ownership is stored in tag_and_id_, and is set in the constructor.
  // This flag bit must be preserved, even across calls to Reset().
  tag_and_id_ = id | (tag_and_id_ & kMessageOwnedArena);
  hint_.store(nullptr, std::memory_order_relaxed);
  threads_.store(nullptr, std::memory_order_relaxed);
#ifndef NDEBUG
  GOOGLE_CHECK_EQ(was_message_owned, IsMessageOwned());
#endif  // NDEBUG
}